

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O3

bool __thiscall
wasm::WasmBinaryBuilder::maybeVisitBinary(WasmBinaryBuilder *this,Expression **out,uint8_t code)

{
  bool bVar1;
  Binary *this_00;
  Expression *pEVar2;
  undefined7 in_register_00000011;
  BinaryOp BVar3;
  
  BVar3 = AddInt32;
  bVar1 = false;
  switch((int)CONCAT71(in_register_00000011,code)) {
  case 0x46:
    BVar3 = EqInt32;
    break;
  case 0x47:
    BVar3 = NeInt32;
    break;
  case 0x48:
    BVar3 = LtSInt32;
    break;
  case 0x49:
    BVar3 = LtUInt32;
    break;
  case 0x4a:
    BVar3 = GtSInt32;
    break;
  case 0x4b:
    BVar3 = GtUInt32;
    break;
  case 0x4c:
    BVar3 = LeSInt32;
    break;
  case 0x4d:
    BVar3 = LeUInt32;
    break;
  case 0x4e:
    BVar3 = GeSInt32;
    break;
  case 0x4f:
    BVar3 = GeUInt32;
    break;
  default:
    goto switchD_009737a0_caseD_50;
  case 0x51:
    BVar3 = EqInt64;
    break;
  case 0x52:
    BVar3 = NeInt64;
    break;
  case 0x53:
    BVar3 = LtSInt64;
    break;
  case 0x54:
    BVar3 = LtUInt64;
    break;
  case 0x55:
    BVar3 = GtSInt64;
    break;
  case 0x56:
    BVar3 = GtUInt64;
    break;
  case 0x57:
    BVar3 = LeSInt64;
    break;
  case 0x58:
    BVar3 = LeUInt64;
    break;
  case 0x59:
    BVar3 = GeSInt64;
    break;
  case 0x5a:
    BVar3 = GeUInt64;
    break;
  case 0x5b:
    BVar3 = EqFloat32;
    break;
  case 0x5c:
    BVar3 = NeFloat32;
    break;
  case 0x5d:
    BVar3 = LtFloat32;
    break;
  case 0x5e:
    BVar3 = GtFloat32;
    break;
  case 0x5f:
    BVar3 = LeFloat32;
    break;
  case 0x60:
    BVar3 = GeFloat32;
    break;
  case 0x61:
    BVar3 = EqFloat64;
    break;
  case 0x62:
    BVar3 = NeFloat64;
    break;
  case 99:
    BVar3 = LtFloat64;
    break;
  case 100:
    BVar3 = GtFloat64;
    break;
  case 0x65:
    BVar3 = LeFloat64;
    break;
  case 0x66:
    BVar3 = GeFloat64;
    break;
  case 0x6a:
    break;
  case 0x6b:
    BVar3 = SubInt32;
    break;
  case 0x6c:
    BVar3 = MulInt32;
    break;
  case 0x6d:
    BVar3 = DivSInt32;
    break;
  case 0x6e:
    BVar3 = DivUInt32;
    break;
  case 0x6f:
    BVar3 = RemSInt32;
    break;
  case 0x70:
    BVar3 = RemUInt32;
    break;
  case 0x71:
    BVar3 = AndInt32;
    break;
  case 0x72:
    BVar3 = OrInt32;
    break;
  case 0x73:
    BVar3 = XorInt32;
    break;
  case 0x74:
    BVar3 = ShlInt32;
    break;
  case 0x75:
    BVar3 = ShrSInt32;
    break;
  case 0x76:
    BVar3 = ShrUInt32;
    break;
  case 0x77:
    BVar3 = RotLInt32;
    break;
  case 0x78:
    BVar3 = RotRInt32;
    break;
  case 0x7c:
    BVar3 = AddInt64;
    break;
  case 0x7d:
    BVar3 = SubInt64;
    break;
  case 0x7e:
    BVar3 = MulInt64;
    break;
  case 0x7f:
    BVar3 = DivSInt64;
    break;
  case 0x80:
    BVar3 = DivUInt64;
    break;
  case 0x81:
    BVar3 = RemSInt64;
    break;
  case 0x82:
    BVar3 = RemUInt64;
    break;
  case 0x83:
    BVar3 = AndInt64;
    break;
  case 0x84:
    BVar3 = OrInt64;
    break;
  case 0x85:
    BVar3 = XorInt64;
    break;
  case 0x86:
    BVar3 = ShlInt64;
    break;
  case 0x87:
    BVar3 = ShrSInt64;
    break;
  case 0x88:
    BVar3 = ShrUInt64;
    break;
  case 0x89:
    BVar3 = RotLInt64;
    break;
  case 0x8a:
    BVar3 = RotRInt64;
    break;
  case 0x92:
    BVar3 = AddFloat32;
    break;
  case 0x93:
    BVar3 = SubFloat32;
    break;
  case 0x94:
    BVar3 = MulFloat32;
    break;
  case 0x95:
    BVar3 = DivFloat32;
    break;
  case 0x96:
    BVar3 = MinFloat32;
    break;
  case 0x97:
    BVar3 = MaxFloat32;
    break;
  case 0x98:
    BVar3 = CopySignFloat32;
    break;
  case 0xa0:
    BVar3 = AddFloat64;
    break;
  case 0xa1:
    BVar3 = SubFloat64;
    break;
  case 0xa2:
    BVar3 = MulFloat64;
    break;
  case 0xa3:
    BVar3 = DivFloat64;
    break;
  case 0xa4:
    BVar3 = MinFloat64;
    break;
  case 0xa5:
    BVar3 = MaxFloat64;
    break;
  case 0xa6:
    BVar3 = CopySignFloat64;
  }
  this_00 = (Binary *)MixedArena::allocSpace(this->allocator,0x28,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  this_00->op = BVar3;
  bVar1 = isDebugEnabled("binary");
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"zz node: Binary\n",0x10);
  }
  pEVar2 = popNonVoidExpression(this);
  this_00->right = pEVar2;
  pEVar2 = popNonVoidExpression(this);
  this_00->left = pEVar2;
  Binary::finalize(this_00);
  *out = (Expression *)this_00;
  bVar1 = true;
switchD_009737a0_caseD_50:
  return bVar1;
}

Assistant:

bool WasmBinaryBuilder::maybeVisitBinary(Expression*& out, uint8_t code) {
  Binary* curr;
#define INT_TYPED_CODE(code)                                                   \
  {                                                                            \
    case BinaryConsts::I32##code:                                              \
      curr = allocator.alloc<Binary>();                                        \
      curr->op = code##Int32;                                                  \
      break;                                                                   \
    case BinaryConsts::I64##code:                                              \
      curr = allocator.alloc<Binary>();                                        \
      curr->op = code##Int64;                                                  \
      break;                                                                   \
  }
#define FLOAT_TYPED_CODE(code)                                                 \
  {                                                                            \
    case BinaryConsts::F32##code:                                              \
      curr = allocator.alloc<Binary>();                                        \
      curr->op = code##Float32;                                                \
      break;                                                                   \
    case BinaryConsts::F64##code:                                              \
      curr = allocator.alloc<Binary>();                                        \
      curr->op = code##Float64;                                                \
      break;                                                                   \
  }
#define TYPED_CODE(code)                                                       \
  {                                                                            \
    INT_TYPED_CODE(code)                                                       \
    FLOAT_TYPED_CODE(code)                                                     \
  }

  switch (code) {
    TYPED_CODE(Add);
    TYPED_CODE(Sub);
    TYPED_CODE(Mul);
    INT_TYPED_CODE(DivS);
    INT_TYPED_CODE(DivU);
    INT_TYPED_CODE(RemS);
    INT_TYPED_CODE(RemU);
    INT_TYPED_CODE(And);
    INT_TYPED_CODE(Or);
    INT_TYPED_CODE(Xor);
    INT_TYPED_CODE(Shl);
    INT_TYPED_CODE(ShrU);
    INT_TYPED_CODE(ShrS);
    INT_TYPED_CODE(RotL);
    INT_TYPED_CODE(RotR);
    FLOAT_TYPED_CODE(Div);
    FLOAT_TYPED_CODE(CopySign);
    FLOAT_TYPED_CODE(Min);
    FLOAT_TYPED_CODE(Max);
    TYPED_CODE(Eq);
    TYPED_CODE(Ne);
    INT_TYPED_CODE(LtS);
    INT_TYPED_CODE(LtU);
    INT_TYPED_CODE(LeS);
    INT_TYPED_CODE(LeU);
    INT_TYPED_CODE(GtS);
    INT_TYPED_CODE(GtU);
    INT_TYPED_CODE(GeS);
    INT_TYPED_CODE(GeU);
    FLOAT_TYPED_CODE(Lt);
    FLOAT_TYPED_CODE(Le);
    FLOAT_TYPED_CODE(Gt);
    FLOAT_TYPED_CODE(Ge);
    default:
      return false;
  }
  BYN_TRACE("zz node: Binary\n");
  curr->right = popNonVoidExpression();
  curr->left = popNonVoidExpression();
  curr->finalize();
  out = curr;
  return true;
#undef TYPED_CODE
#undef INT_TYPED_CODE
#undef FLOAT_TYPED_CODE
}